

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O3

vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> * __thiscall
dg::vr::StructureAnalyzer::getRelevantConditions
          (vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>
           *__return_storage_ptr__,StructureAnalyzer *this,VRAssumeBool *assume)

{
  PHINode **ppPVar1;
  PHINode *pPVar2;
  ICmpInst *pIVar3;
  pointer ppVVar4;
  pointer ppIVar5;
  pointer ppVVar6;
  vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> result;
  PHINode *phi;
  ICmpInst *icmp;
  pointer local_98;
  ICmpInst **ppIStack_90;
  ICmpInst **local_88;
  PHINode **local_78;
  PHINode **local_70;
  PHINode **local_68;
  vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> local_60;
  StructureAnalyzer *local_48;
  ICmpInst *local_40;
  ICmpInst *local_38;
  
  pPVar2 = (PHINode *)(assume->super_VRAssume).val;
  local_48 = this;
  if (pPVar2 == (PHINode *)0x0 || pPVar2[0x10] != (PHINode)0x50) {
    if (pPVar2 == (PHINode *)0x0 || pPVar2[0x10] != (PHINode)0x52) {
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      local_98 = (pointer)0x0;
      ppIStack_90 = (ICmpInst **)0x0;
      local_88 = (ICmpInst **)0x0;
      local_78 = (PHINode **)operator_new(8);
      local_70 = local_78 + 1;
      *local_78 = pPVar2;
      local_68 = local_70;
      do {
        ppPVar1 = local_70 + -1;
        local_70 = local_70 + -1;
        possibleSources(&local_60,local_48,*ppPVar1,assume->assumption);
        ppVVar4 = local_60.
                  super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pIVar3 = local_40;
        for (ppVVar6 = local_60.
                       super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; local_40 = pIVar3,
            ppVVar6 != ppVVar4; ppVVar6 = ppVVar6 + 1) {
          local_40 = (ICmpInst *)
                     ((*ppVVar6)->op)._M_t.
                     super___uniq_ptr_impl<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>._M_t.
                     super__Tuple_impl<0UL,_dg::vr::VROp_*,_std::default_delete<dg::vr::VROp>_>.
                     super__Head_base<0UL,_dg::vr::VROp_*,_false>._M_head_impl[1]._vptr_VROp;
          local_38 = local_40;
          if (local_40[0x10] != (ICmpInst)0x50) {
            local_38 = (ICmpInst *)0x0;
          }
          if (local_38 == (ICmpInst *)0x0) {
            if (local_40[0x10] != (ICmpInst)0x52) {
              local_40 = (ICmpInst *)0x0;
            }
            if (local_40 == (ICmpInst *)0x0) {
              (__return_storage_ptr__->
              super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>).
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (__return_storage_ptr__->
              super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>).
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (__return_storage_ptr__->
              super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if (local_60.
                  super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_60.
                                super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_60.
                                      super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_60.
                                      super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              goto LAB_00127ac0;
            }
            if (local_70 == local_68) {
              std::vector<llvm::PHINode_const*,std::allocator<llvm::PHINode_const*>>::
              _M_realloc_insert<llvm::PHINode_const*&>
                        ((vector<llvm::PHINode_const*,std::allocator<llvm::PHINode_const*>> *)
                         &local_78,(iterator)local_70,(PHINode **)&local_40);
            }
            else {
              *local_70 = (PHINode *)local_40;
              local_70 = local_70 + 1;
            }
          }
          else if (ppIStack_90 == local_88) {
            local_40 = pIVar3;
            std::vector<llvm::ICmpInst_const*,std::allocator<llvm::ICmpInst_const*>>::
            _M_realloc_insert<llvm::ICmpInst_const*&>
                      ((vector<llvm::ICmpInst_const*,std::allocator<llvm::ICmpInst_const*>> *)
                       &local_98,(iterator)ppIStack_90,&local_38);
          }
          else {
            *ppIStack_90 = local_38;
            ppIStack_90 = ppIStack_90 + 1;
            local_40 = pIVar3;
          }
          pIVar3 = local_40;
        }
        if (local_60.
            super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.
                          super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_60.
                                super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.
                                super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      } while (local_78 != local_70);
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
      super__Vector_impl_data._M_start = local_98;
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = ppIStack_90;
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_88;
      local_98 = (pointer)0x0;
      ppIStack_90 = (ICmpInst **)0x0;
      local_88 = (ICmpInst **)0x0;
LAB_00127ac0:
      if (local_78 != (PHINode **)0x0) {
        operator_delete(local_78,(long)local_68 - (long)local_78);
      }
      if (local_98 != (pointer)0x0) {
        operator_delete(local_98,(long)local_88 - (long)local_98);
      }
    }
  }
  else {
    ppIVar5 = (pointer)operator_new(8);
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
    super__Vector_impl_data._M_start = ppIVar5;
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = ppIVar5 + 1;
    *ppIVar5 = (ICmpInst *)pPVar2;
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = ppIVar5 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const llvm::ICmpInst *>
StructureAnalyzer::getRelevantConditions(const VRAssumeBool *assume) const {
    if (const auto *icmp = llvm::dyn_cast<llvm::ICmpInst>(assume->getValue()))
        return {icmp};

    const auto *phi = llvm::dyn_cast<llvm::PHINode>(assume->getValue());
    if (!phi)
        return {};

    std::vector<const llvm::ICmpInst *> result;
    std::vector<const llvm::PHINode *> to_process{phi};

    while (!to_process.empty()) {
        const auto *phi = to_process.back();
        to_process.pop_back();

        for (const auto *sourceEdge :
             possibleSources(phi, assume->getAssumption())) {
            assert(sourceEdge->op->isInstruction());
            const llvm::Instruction *inst =
                    static_cast<const VRInstruction *>(sourceEdge->op.get())
                            ->getInstruction();
            if (const auto *icmp = llvm::dyn_cast<llvm::ICmpInst>(inst))
                result.emplace_back(icmp);
            else if (const auto *phi = llvm::dyn_cast<llvm::PHINode>(inst))
                to_process.emplace_back(phi);
            else
                return {};
        }
    }
    return result;
}